

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
randomx::CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true>::CompiledVm
          (CompiledVm<randomx::AlignedAllocator<64UL>,_false,_true> *this)

{
  VmBase<randomx::AlignedAllocator<64UL>,_false> *in_RDI;
  JitCompilerX86 *unaff_retaddr;
  
  VmBase<randomx::AlignedAllocator<64UL>,_false>::VmBase(in_RDI);
  (in_RDI->super_randomx_vm)._vptr_randomx_vm = (_func_int **)&PTR__CompiledVm_001645a8;
  JitCompilerX86::JitCompilerX86(unaff_retaddr);
  return;
}

Assistant:

CompiledVm<Allocator, softAes, secureJit>::CompiledVm() {
		if (!secureJit) {
			compiler.enableAll(); //make JIT buffer both writable and executable
		}
	}